

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drm.c
# Opt level: O1

void dump_drm_nouveau_gem_info(drm_nouveau_gem_info *info)

{
  char *pcVar1;
  
  fprintf(_stdout,"handle: %s%3d%s, domain: ",colors->num,(ulong)info->handle,colors->reset);
  decode_domain(info->domain,0xe);
  pcVar1 = colors->reset;
  fprintf(_stdout,
          ", size: %s0x%-8lx%s, gpu_start: %s0x%-8lx%s, mmap_offset: %s0x%-10lx%s, tile_mode: %s0x%02x%s, tile_flags: %s0x%04x%s"
          ,colors->num,info->size,pcVar1,colors->mem,info->offset,pcVar1,colors->num,
          info->map_handle,pcVar1,colors->iname,(ulong)info->tile_mode,pcVar1,colors->iname,
          (ulong)info->tile_flags,pcVar1);
  return;
}

Assistant:

static void dump_drm_nouveau_gem_info(struct drm_nouveau_gem_info *info)
{
	mmt_log_cont("handle: %s%3d%s, domain: ", colors->num, info->handle,
			colors->reset);

	decode_domain(info->domain, 14);

	mmt_log_cont(", size: %s0x%-8" PRIx64 "%s, gpu_start: %s0x%-8" PRIx64 "%s, mmap_offset: %s0x%-10" PRIx64 "%s, tile_mode: %s0x%02x%s, tile_flags: %s0x%04x%s",
			colors->num, info->size, colors->reset,
			colors->mem, info->offset, colors->reset, colors->num, info->map_handle,
			colors->reset, colors->iname, info->tile_mode, colors->reset,
			colors->iname, info->tile_flags, colors->reset);
}